

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

int RemoveClass(PClass *cls)

{
  bool bVar1;
  bool bVar2;
  AActor *this;
  PClass *pPVar3;
  int iVar4;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator local_40;
  
  FThinkerIterator::FThinkerIterator(&local_40,cls,0x80);
  iVar4 = 0;
  bVar1 = false;
  while (bVar2 = bVar1, this = (AActor *)FThinkerIterator::Next(&local_40), this != (AActor *)0x0) {
    pPVar3 = DObject::GetClass((DObject *)this);
    bVar1 = bVar2;
    if ((pPVar3 == cls) && (bVar1 = true, this->player == (player_t *)0x0)) {
      iVar4 = iVar4 + 1;
      AActor::ClearCounters(this);
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
      bVar1 = bVar2;
    }
  }
  if (bVar2) {
    Printf("Cannot remove live players!\n");
  }
  return iVar4;
}

Assistant:

static int RemoveClass(const PClass *cls)
{
	AActor *actor;
	int removecount = 0;
	bool player = false;
	TThinkerIterator<AActor> iterator(cls);
	while ((actor = iterator.Next()))
	{
		if (actor->IsA(cls))
		{
			// [MC]Do not remove LIVE players.
			if (actor->player != NULL)
			{
				player = true;
				continue;
			}
			removecount++; 
			actor->ClearCounters();
			actor->Destroy();
		}
	}
	if (player)
		Printf("Cannot remove live players!\n");
	return removecount;

}